

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O2

AtomicRMW * __thiscall
wasm::Builder::makeAtomicRMW
          (Builder *this,AtomicRMWOp op,uint bytes,Address offset,Expression *ptr,Expression *value,
          Type type,Name memory)

{
  AtomicRMW *this_00;
  
  this_00 = MixedArena::alloc<wasm::AtomicRMW>(&this->wasm->allocator);
  this_00->op = op;
  this_00->bytes = (uint8_t)bytes;
  (this_00->offset).addr = offset.addr;
  this_00->ptr = ptr;
  this_00->value = value;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.type.id = type.id;
  AtomicRMW::finalize(this_00);
  (this_00->memory).super_IString.str._M_len = memory.super_IString.str._M_len;
  (this_00->memory).super_IString.str._M_str = memory.super_IString.str._M_str;
  return this_00;
}

Assistant:

AtomicRMW* makeAtomicRMW(AtomicRMWOp op,
                           unsigned bytes,
                           Address offset,
                           Expression* ptr,
                           Expression* value,
                           Type type,
                           Name memory) {
    auto* ret = wasm.allocator.alloc<AtomicRMW>();
    ret->op = op;
    ret->bytes = bytes;
    ret->offset = offset;
    ret->ptr = ptr;
    ret->value = value;
    ret->type = type;
    ret->finalize();
    ret->memory = memory;
    return ret;
  }